

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

_glist * glist_finddirty(_glist *x)

{
  _glist *x_00;
  _class *p_Var1;
  _glist *p_Var2;
  
  p_Var1 = canvas_class;
  x_00 = (_glist *)x->gl_list;
  while( true ) {
    if (x_00 == (_glist *)0x0) {
      if ((x->gl_env == (_canvasenvironment *)0x0) || ((x->field_0xe8 & 4) == 0)) {
        x = (_glist *)0x0;
      }
      return x;
    }
    if (((x_00->gl_obj).te_g.g_pd == p_Var1) &&
       (p_Var2 = glist_finddirty(x_00), p_Var2 != (_glist *)0x0)) break;
    x_00 = (_glist *)(x_00->gl_obj).te_g.g_next;
  }
  return p_Var2;
}

Assistant:

static t_glist *glist_finddirty(t_glist *x)
{
    t_gobj *g;
    t_glist *g2;
    for (g = x->gl_list; g; g = g->g_next)
        if (pd_class(&g->g_pd) == canvas_class &&
            (g2 = glist_finddirty((t_glist *)g)))
                return (g2);

    if (x->gl_env && x->gl_dirty)
        return (x);
    else
        return (0);
}